

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logger_wrapper.hxx
# Opt level: O0

void __thiscall logger_wrapper::logger_wrapper(logger_wrapper *this,string *log_file,int log_level)

{
  void *pvVar1;
  SimpleLogger *in_RDI;
  SimpleLogger *in_stack_00000040;
  string *in_stack_00000068;
  SimpleLogger *in_stack_00000070;
  undefined8 in_stack_ffffffffffffff98;
  int level;
  allocator *paVar2;
  allocator local_49;
  string local_48 [72];
  
  level = (int)((ulong)in_stack_ffffffffffffff98 >> 0x20);
  nuraft::logger::logger((logger *)in_RDI);
  *(undefined ***)in_RDI = &PTR__logger_wrapper_0076f370;
  pvVar1 = operator_new(0x2c8);
  SimpleLogger::SimpleLogger
            (in_stack_00000070,in_stack_00000068,(size_t)this,(uint64_t)log_file,log_level);
  *(void **)&in_RDI->field_0x8 = pvVar1;
  SimpleLogger::setLogLevel(in_RDI,level);
  SimpleLogger::setDispLevel(in_RDI,level);
  paVar2 = &local_49;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_48,"./",paVar2);
  SimpleLogger::setCrashDumpPath(&in_RDI->filePath,SUB81((ulong)paVar2 >> 0x38,0));
  std::__cxx11::string::~string(local_48);
  std::allocator<char>::~allocator((allocator<char> *)&local_49);
  SimpleLogger::start(in_stack_00000040);
  return;
}

Assistant:

logger_wrapper(const std::string& log_file, int log_level = 6) {
        my_log_ = new SimpleLogger(log_file, 1024, 32*1024*1024, 10);
        my_log_->setLogLevel(log_level);
        my_log_->setDispLevel(-1);
        my_log_->setCrashDumpPath("./", true);
        my_log_->start();
    }